

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O1

planck_unit_result_t
planck_unit_assert_str_are_equal
          (planck_unit_test_t *state,char *expected,char *actual,int line,char *file)

{
  int iVar1;
  char *__s;
  planck_unit_result_t pVar2;
  
  state->allocated_message = '\x01';
  iVar1 = snprintf((char *)0x0,0,"expected \\\"%s\\\", got \\\"%s\\\"",expected,actual);
  __s = (char *)malloc((long)(iVar1 + 1));
  if ((__s != (char *)0x0) && (iVar1 + 1 != 0)) {
    pVar2 = '\0';
    sprintf(__s,"expected \\\"%s\\\", got \\\"%s\\\"",expected,actual);
    iVar1 = strcmp(expected,actual);
    if (iVar1 == 0) {
      if (state->allocated_message == '\x01') {
        free(__s);
      }
      state->allocated_message = '\0';
      __s = "";
      line = -1;
      pVar2 = '\x01';
    }
    state->result = pVar2;
    state->line = line;
    state->file = file;
    state->message = __s;
    return pVar2;
  }
  free(__s);
  printf("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

planck_unit_result_t
planck_unit_assert_str_are_equal(
	planck_unit_test_t	*state,
	char				*expected,
	char				*actual,
	int					line,
	const char			*file
) {
	const char	*message;
	int			message_size;
	char		*buffer;

	message						= "expected \\\"%s\\\", got \\\"%s\\\"";
	state->allocated_message	= 1;
	message_size				= planck_unit_check_string_space(message, expected, actual);
	buffer						= malloc(message_size);

	if ((NULL == buffer) || !message_size) {
		free(buffer);
		PLANCK_UNIT_PRINT_STR("out of memory");
		exit(-1);
	}

	sprintf(buffer, message, expected, actual);

	return planck_unit_assert_true(state, 0 == strcmp(expected, actual), line, file, buffer);
}